

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O2

bool __thiscall cmParseBlanketJSCoverage::ReadJSONFile(cmParseBlanketJSCoverage *this,string *file)

{
  cmCTest *this_00;
  ostream *poVar1;
  JSONParser parser;
  char *local_1d0 [4];
  string local_1b0;
  ostringstream cmCTestLog_msg;
  
  parser.Coverage = this->Coverage;
  parser._vptr_JSONParser = (_func_int **)&PTR__JSONParser_00683708;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"Parsing ");
  poVar1 = std::operator<<(poVar1,(string *)file);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0xa1,local_1d0[0],this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string((string *)&local_1b0,(string *)file);
  JSONParser::ParseFile(&parser,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::ReadJSONFile(std::string file)
  {
  cmParseBlanketJSCoverage::JSONParser parser
     (this->Coverage);
  cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Parsing " << file << std::endl, this->Coverage.Quiet);
  parser.ParseFile(file);
  return true;
  }